

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> __thiscall
QHashPrivate::iterator<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::operator++
          (iterator<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this)

{
  bool bVar1;
  Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *pDVar2;
  size_t sVar3;
  iterator<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> iVar4;
  
  do {
    sVar3 = this->bucket + 1;
    this->bucket = sVar3;
    if (sVar3 == this->d->numBuckets) {
      this->d = (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *)0x0;
      this->bucket = 0;
      sVar3 = 0;
      pDVar2 = (Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *)0x0;
      goto LAB_002949ed;
    }
    bVar1 = isUnused(this);
  } while (bVar1);
  pDVar2 = this->d;
  sVar3 = this->bucket;
LAB_002949ed:
  iVar4.bucket = sVar3;
  iVar4.d = pDVar2;
  return iVar4;
}

Assistant:

iterator operator++() noexcept
    {
        while (true) {
            ++bucket;
            if (bucket == d->numBuckets) {
                d = nullptr;
                bucket = 0;
                break;
            }
            if (!isUnused())
                break;
        }
        return *this;
    }